

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O0

bool __thiscall
ONX_Model::IncrementalReadBegin
          (ONX_Model *this,ON_BinaryArchive *archive,bool bManageComponents,uint table_filter,
          ON_TextLog *error_log)

{
  Status SVar1;
  bool bVar2;
  uint uVar3;
  Status SVar4;
  int iVar5;
  int iVar6;
  uchar auVar7 [8];
  ON_ModelComponent *pOVar8;
  ON_UUID *pOVar9;
  ON_UUID layer_model_id;
  bool local_472;
  bool local_471;
  bool local_443;
  bool local_442;
  bool local_441;
  uchar local_3c8 [8];
  bool local_3a3;
  bool local_3a2;
  bool local_3a1;
  bool local_383;
  bool local_382;
  bool local_381;
  bool local_363;
  bool local_362;
  bool local_361;
  undefined1 local_338 [24];
  ON_InstanceDefinition *instance_definition;
  ON_wString local_318;
  undefined1 local_310 [24];
  ON_String OStack_2f8;
  bool bSetAsCurrent_4;
  ON_HatchPattern *hatch_pattern;
  ON_wString local_2e8;
  byte local_2de;
  byte local_2dd;
  int local_2dc;
  undefined1 auStack_2d8 [2];
  bool bSetCurrentByIndex_4;
  bool bSetCurrentById_4;
  int settings_current_index_4;
  ON_UUID settings_current_id_4;
  ON_ModelGeometryComponent *local_2b8;
  ON_ModelGeometryComponent *model_light;
  long local_2a8;
  undefined1 local_2a0 [24];
  ON_String OStack_288;
  bool bSetAsCurrent_3;
  ON_DimStyle *dimension_style;
  ON_wString local_278;
  bool local_26e;
  byte local_26d;
  int local_26c;
  undefined1 auStack_268 [2];
  bool bSetCurrentByIndex_3;
  bool bSetCurrentById_3;
  int settings_current_index_3;
  ON_UUID settings_current_id_3;
  ON_Group *local_248;
  ON_Group *group;
  ON__UINT64 local_238;
  ON__UINT64 OStack_230;
  uchar local_228 [8];
  ON_Layer *layer_1;
  ONX_ModelComponentIterator layer_it;
  int layer_count;
  undefined1 local_1a0 [24];
  ON_Layer *current_layer;
  ON_UUID current_layer_id;
  undefined1 local_160 [24];
  ON_wString OStack_148;
  bool bSetAsCurrent_2;
  ON_Layer *layer;
  ON_wString local_138;
  bool local_12e;
  byte local_12d;
  Status local_12c;
  undefined1 auStack_128 [2];
  bool bSetCurrentByIndex_2;
  bool bSetCurrentById_2;
  int settings_current_index_2;
  ON_UUID settings_current_id_2;
  undefined1 local_108 [24];
  ON_wString OStack_f0;
  bool bSetAsCurrent_1;
  ON_Linetype *line_pattern;
  ON_wString local_e0;
  bool local_d6;
  byte local_d5;
  int local_d4;
  undefined1 auStack_d0 [2];
  bool bSetCurrentByIndex_1;
  bool bSetCurrentById_1;
  int settings_current_index_1;
  ON_UUID settings_current_id_1;
  undefined1 local_b0 [24];
  ON_String OStack_98;
  bool bSetAsCurrent;
  ON_Material *material;
  ON_wString local_88;
  bool local_7e;
  byte local_7d;
  int local_7c;
  undefined1 auStack_78 [2];
  bool bSetCurrentByIndex;
  bool bSetCurrentById;
  int settings_current_index;
  ON_UUID settings_current_id;
  ON_wString local_58;
  ON_TextureMapping *texture_mapping;
  ON_wString local_40;
  ON_Bitmap *bitmap;
  int rc;
  bool bUpdateComponentIdentification;
  bool bResolveIdAndNameConflicts;
  ON_TextLog *error_log_local;
  uint table_filter_local;
  bool bManageComponents_local;
  ON_BinaryArchive *archive_local;
  ONX_Model *this_local;
  
  _rc = (wchar_t *)error_log;
  error_log_local._0_4_ = table_filter;
  error_log_local._7_1_ = bManageComponents;
  _table_filter_local = (wchar_t *)archive;
  archive_local = (ON_BinaryArchive *)this;
  Reset(this);
  bitmap._7_1_ = 1;
  bitmap._6_1_ = 1;
  if ((uint)error_log_local == 0) {
    error_log_local._0_4_ = 0xffffffff;
  }
  bVar2 = ON_BinaryArchive::Read3dmStartSection
                    ((ON_BinaryArchive *)_table_filter_local,&this->m_3dm_file_version,
                     &this->m_sStartSectionComments);
  if (bVar2) {
    bVar2 = ON_BinaryArchive::Read3dmProperties
                      ((ON_BinaryArchive *)_table_filter_local,&this->m_properties);
    if (bVar2) {
      uVar3 = ON_BinaryArchive::ArchiveOpenNURBSVersion((ON_BinaryArchive *)_table_filter_local);
      this->m_3dm_opennurbs_version = uVar3;
      bVar2 = ON_BinaryArchive::Read3dmSettings
                        ((ON_BinaryArchive *)_table_filter_local,&this->m_settings);
      if (bVar2) {
        bVar2 = ON_BinaryArchive::BeginRead3dmBitmapTable((ON_BinaryArchive *)_table_filter_local);
        if (bVar2) {
          if (((uint)error_log_local & 8) != 0) {
            while( true ) {
              local_40.m_s = (wchar_t *)0x0;
              bitmap._0_4_ = ON_BinaryArchive::Read3dmBitmap
                                       ((ON_BinaryArchive *)_table_filter_local,
                                        (ON_Bitmap **)&local_40);
              if (((int)bitmap == 0) || ((int)bitmap < 0)) break;
              AddModelComponentForExperts
                        ((ONX_Model *)&texture_mapping,(ON_ModelComponent *)this,
                         SUB81(local_40.m_s,0),(bool)(error_log_local._7_1_ & 1),true);
              bVar2 = ON_ModelComponentReference::IsEmpty
                                ((ON_ModelComponentReference *)&texture_mapping);
              ON_ModelComponentReference::~ON_ModelComponentReference
                        ((ON_ModelComponentReference *)&texture_mapping);
              if ((bVar2) && (local_40.m_s != (wchar_t *)0x0)) {
                (**(code **)(*(long *)local_40.m_s + 0x20))();
              }
            }
          }
          bVar2 = ON_BinaryArchive::EndRead3dmBitmapTable((ON_BinaryArchive *)_table_filter_local);
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = ON_BinaryArchive::BeginRead3dmTextureMappingTable
                          ((ON_BinaryArchive *)_table_filter_local);
        if (bVar2) {
          if (((uint)error_log_local & 0x10) != 0) {
            while( true ) {
              local_58.m_s = (wchar_t *)0x0;
              bitmap._0_4_ = ON_BinaryArchive::Read3dmTextureMapping
                                       ((ON_BinaryArchive *)_table_filter_local,
                                        (ON_TextureMapping **)&local_58);
              if (((int)bitmap == 0) || ((int)bitmap < 0)) break;
              AddModelComponentForExperts
                        ((ONX_Model *)settings_current_id.Data4,(ON_ModelComponent *)this,
                         SUB81(local_58.m_s,0),(bool)(error_log_local._7_1_ & 1),true);
              bVar2 = ON_ModelComponentReference::IsEmpty
                                ((ON_ModelComponentReference *)settings_current_id.Data4);
              ON_ModelComponentReference::~ON_ModelComponentReference
                        ((ON_ModelComponentReference *)settings_current_id.Data4);
              if ((bVar2) && (local_58.m_s != (wchar_t *)0x0)) {
                (**(code **)(*(long *)local_58.m_s + 0x20))();
              }
            }
          }
          bVar2 = ON_BinaryArchive::EndRead3dmTextureMappingTable
                            ((ON_BinaryArchive *)_table_filter_local);
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = ON_BinaryArchive::BeginRead3dmMaterialTable((ON_BinaryArchive *)_table_filter_local)
        ;
        if (bVar2) {
          _auStack_78 = ON_3dmSettings::CurrentMaterialId(&this->m_settings);
          local_7c = ON_3dmSettings::CurrentMaterialIndex(&this->m_settings);
          bVar2 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)auStack_78);
          local_7d = (bVar2 ^ 0xffU) & 1;
          local_361 = local_7d == 0 && -1 < local_7c;
          local_7e = local_361;
          material = (ON_Material *)0;
          local_88.m_s = (wchar_t *)(uchar  [8])0x0;
          ON_3dmSettings::SetCurrentMaterialId(&this->m_settings,(ON_UUID)ZEXT816((ulong)0));
          if (((uint)error_log_local & 0x20) != 0) {
            while( true ) {
              OStack_98.m_s = (char *)0x0;
              bitmap._0_4_ = ON_BinaryArchive::Read3dmMaterial
                                       ((ON_BinaryArchive *)_table_filter_local,
                                        (ON_Material **)&stack0xffffffffffffff68);
              if (((int)bitmap == 0) || ((int)bitmap < 0)) break;
              if ((local_7d & 1) == 0) {
LAB_005fac4a:
                iVar6 = local_7c;
                local_363 = false;
                if ((local_7e & 1U) != 0) {
                  iVar5 = ON_ModelComponent::Index((ON_ModelComponent *)OStack_98.m_s);
                  local_363 = iVar6 == iVar5;
                }
                local_362 = local_363;
              }
              else {
                pOVar9 = ON_ModelComponent::Id((ON_ModelComponent *)OStack_98.m_s);
                bVar2 = ::operator==((ON_UUID_struct *)auStack_78,pOVar9);
                local_362 = true;
                if (!bVar2) goto LAB_005fac4a;
              }
              local_b0[0x17] = local_362;
              AddModelComponentForExperts
                        ((ONX_Model *)local_b0,(ON_ModelComponent *)this,SUB81(OStack_98.m_s,0),
                         (bool)(error_log_local._7_1_ & 1),true);
              bVar2 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_b0);
              ON_ModelComponentReference::~ON_ModelComponentReference
                        ((ON_ModelComponentReference *)local_b0);
              if (bVar2) {
                if ((ON_Material *)OStack_98.m_s != (ON_Material *)0x0) {
                  (**(code **)(*(long *)OStack_98.m_s + 0x20))();
                }
              }
              else if ((local_b0[0x17] & 1) != 0) {
                pOVar9 = ON_ModelComponent::Id((ON_ModelComponent *)OStack_98.m_s);
                settings_current_id_1.Data4 = *(uchar (*) [8])pOVar9;
                ON_3dmSettings::SetCurrentMaterialId(&this->m_settings,*pOVar9);
                local_7d = 0;
                local_7e = false;
              }
            }
          }
          bVar2 = ON_BinaryArchive::EndRead3dmMaterialTable((ON_BinaryArchive *)_table_filter_local)
          ;
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = ON_BinaryArchive::BeginRead3dmLinetypeTable((ON_BinaryArchive *)_table_filter_local)
        ;
        if (bVar2) {
          _auStack_d0 = ON_3dmSettings::CurrentLinePatternId(&this->m_settings);
          local_d4 = ON_3dmSettings::CurrentLinePatternIndex(&this->m_settings);
          bVar2 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)auStack_d0);
          local_d5 = (bVar2 ^ 0xffU) & 1;
          local_381 = local_d5 == 0 && -1 < local_d4;
          local_d6 = local_381;
          line_pattern = (ON_Linetype *)0;
          local_e0.m_s = (wchar_t *)(uchar  [8])0x0;
          ON_3dmSettings::SetCurrentLinePatternId(&this->m_settings,(ON_UUID)ZEXT816((ulong)0));
          if (((uint)error_log_local & 0x40) != 0) {
            while( true ) {
              OStack_f0.m_s = (wchar_t *)0x0;
              bitmap._0_4_ = ON_BinaryArchive::Read3dmLinetype
                                       ((ON_BinaryArchive *)_table_filter_local,
                                        (ON_Linetype **)&stack0xffffffffffffff10);
              if (((int)bitmap == 0) || ((int)bitmap < 0)) break;
              if ((local_d5 & 1) == 0) {
LAB_005faee9:
                iVar6 = local_d4;
                local_383 = false;
                if ((local_d6 & 1U) != 0) {
                  iVar5 = ON_ModelComponent::Index((ON_ModelComponent *)OStack_f0.m_s);
                  local_383 = iVar6 == iVar5;
                }
                local_382 = local_383;
              }
              else {
                pOVar9 = ON_ModelComponent::Id((ON_ModelComponent *)OStack_f0.m_s);
                bVar2 = ::operator==((ON_UUID_struct *)auStack_d0,pOVar9);
                local_382 = true;
                if (!bVar2) goto LAB_005faee9;
              }
              local_108[0x17] = local_382;
              AddModelComponentForExperts
                        ((ONX_Model *)local_108,(ON_ModelComponent *)this,SUB81(OStack_f0.m_s,0),
                         (bool)(error_log_local._7_1_ & 1),true);
              bVar2 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_108);
              ON_ModelComponentReference::~ON_ModelComponentReference
                        ((ON_ModelComponentReference *)local_108);
              if (bVar2) {
                if ((ON_Linetype *)OStack_f0.m_s != (ON_Linetype *)0x0) {
                  (**(code **)(*(long *)OStack_f0.m_s + 0x20))();
                }
              }
              else if ((local_108[0x17] & 1) != 0) {
                pOVar9 = ON_ModelComponent::Id((ON_ModelComponent *)OStack_f0.m_s);
                settings_current_id_2.Data4 = *(uchar (*) [8])pOVar9;
                ON_3dmSettings::SetCurrentLinePatternId(&this->m_settings,*pOVar9);
                local_d5 = 0;
                local_d6 = false;
              }
            }
          }
          bVar2 = ON_BinaryArchive::EndRead3dmLinetypeTable((ON_BinaryArchive *)_table_filter_local)
          ;
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = ON_BinaryArchive::BeginRead3dmLayerTable((ON_BinaryArchive *)_table_filter_local);
        if (bVar2) {
          _auStack_128 = ON_3dmSettings::CurrentLayerId(&this->m_settings);
          local_12c = ON_3dmSettings::CurrentLayerIndex(&this->m_settings);
          bVar2 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)auStack_128);
          local_12d = (bVar2 ^ 0xffU) & 1;
          local_3a1 = local_12d == 0 && -1 < (int)local_12c;
          local_12e = local_3a1;
          layer = (ON_Layer *)0;
          local_138.m_s = (wchar_t *)(uchar  [8])0x0;
          ON_3dmSettings::SetCurrentLayerId(&this->m_settings,(ON_UUID)ZEXT816((ulong)0));
          if (((uint)error_log_local & 0x80) != 0) {
            while( true ) {
              OStack_148.m_s = (wchar_t *)0x0;
              bitmap._0_4_ = ON_BinaryArchive::Read3dmLayer
                                       ((ON_BinaryArchive *)_table_filter_local,
                                        (ON_Layer **)&stack0xfffffffffffffeb8);
              if (((int)bitmap == 0) || ((int)bitmap < 0)) break;
              if ((local_12d & 1) == 0) {
LAB_005fb197:
                SVar1 = local_12c;
                local_3a3 = false;
                if ((local_12e & 1U) != 0) {
                  SVar4 = ON_ModelComponent::Index((ON_ModelComponent *)OStack_148.m_s);
                  local_3a3 = SVar1 == SVar4;
                }
                local_3a2 = local_3a3;
              }
              else {
                pOVar9 = ON_ModelComponent::Id((ON_ModelComponent *)OStack_148.m_s);
                bVar2 = ::operator==((ON_UUID_struct *)auStack_128,pOVar9);
                local_3a2 = true;
                if (!bVar2) goto LAB_005fb197;
              }
              local_160[0x17] = local_3a2;
              AddModelComponentForExperts
                        ((ONX_Model *)local_160,(ON_ModelComponent *)this,SUB81(OStack_148.m_s,0),
                         (bool)(error_log_local._7_1_ & 1),true);
              bVar2 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_160);
              ON_ModelComponentReference::~ON_ModelComponentReference
                        ((ON_ModelComponentReference *)local_160);
              if (bVar2) {
                if ((ON_Layer *)OStack_148.m_s != (ON_Layer *)0x0) {
                  (**(code **)(*(long *)OStack_148.m_s + 0x20))();
                }
              }
              else if ((local_160[0x17] & 1) != 0) {
                pOVar9 = ON_ModelComponent::Id((ON_ModelComponent *)OStack_148.m_s);
                ON_3dmSettings::SetCurrentLayerId(&this->m_settings,*pOVar9);
                local_12d = 0;
                local_12e = false;
              }
            }
          }
          bVar2 = ON_BinaryArchive::EndRead3dmLayerTable((ON_BinaryArchive *)_table_filter_local);
          if (!bVar2) {
            return false;
          }
          _current_layer = ON_3dmSettings::CurrentLayerId(&this->m_settings);
          bVar2 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)&current_layer);
          if (bVar2) {
            local_3c8[0] = '\0';
            local_3c8[1] = '\0';
            local_3c8[2] = '\0';
            local_3c8[3] = '\0';
            local_3c8[4] = '\0';
            local_3c8[5] = '\0';
            local_3c8[6] = '\0';
            local_3c8[7] = '\0';
            local_1a0._16_8_ = local_3c8;
          }
          else {
            layer_model_id.Data4 = (uchar  [8])current_layer;
            layer_model_id._0_8_ = this;
            LayerFromId((ONX_Model *)local_1a0,layer_model_id);
            auVar7 = (uchar  [8])
                     ON_Layer::FromModelComponentRef
                               ((ON_ModelComponentReference *)local_1a0,(ON_Layer *)0x0);
            ON_ModelComponentReference::~ON_ModelComponentReference
                      ((ON_ModelComponentReference *)local_1a0);
            local_1a0._16_8_ = auVar7;
          }
          if ((uchar  [8])local_1a0._16_8_ == (uchar  [8])0x0) {
            _current_layer = (ON_UUID)ZEXT816(0);
            layer_it.m_current_component_weak_ref.m_wp.
            super___weak_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
                 = 0;
            ONX_ModelComponentIterator::ONX_ModelComponentIterator
                      ((ONX_ModelComponentIterator *)&layer_1,this,Layer);
            pOVar8 = ONX_ModelComponentIterator::FirstComponent
                               ((ONX_ModelComponentIterator *)&layer_1);
            local_228 = (uchar  [8])ON_Layer::Cast(&pOVar8->super_ON_Object);
            while (local_228 != (uchar  [8])0x0) {
              layer_it.m_current_component_weak_ref.m_wp.
              super___weak_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
              _0_4_ = (int)layer_it.m_current_component_weak_ref.m_wp.
                           super___weak_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 1;
              bVar2 = ON_Layer::IsVisible((ON_Layer *)local_228);
              if ((bVar2) &&
                 (bVar2 = ON_ModelComponent::IsLocked((ON_ModelComponent *)local_228), !bVar2)) {
                local_1a0[0x10] = local_228[0];
                local_1a0[0x11] = local_228[1];
                local_1a0[0x12] = local_228[2];
                local_1a0[0x13] = local_228[3];
                local_1a0[0x14] = local_228[4];
                local_1a0[0x15] = local_228[5];
                local_1a0[0x16] = local_228[6];
                local_1a0[0x17] = local_228[7];
                bVar2 = ON_ModelComponent::ParentIdIsNil((ON_ModelComponent *)local_228);
                if (bVar2) break;
              }
              pOVar8 = ONX_ModelComponentIterator::NextComponent
                                 ((ONX_ModelComponentIterator *)&layer_1);
              local_228 = (uchar  [8])ON_Layer::Cast(&pOVar8->super_ON_Object);
            }
            if (((uchar  [8])local_1a0._16_8_ == (uchar  [8])0x0) &&
               (0 < (int)layer_it.m_current_component_weak_ref.m_wp.
                         super___weak_ptr<ON_ModelComponent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                         ._M_pi)) {
              pOVar8 = ONX_ModelComponentIterator::FirstComponent
                                 ((ONX_ModelComponentIterator *)&layer_1);
              local_1a0._16_8_ = ON_Layer::Cast(&pOVar8->super_ON_Object);
            }
            if ((uchar  [8])local_1a0._16_8_ == (uchar  [8])0x0) {
              group._4_4_ = ON_Color::UnsetColor.field_0;
              AddDefaultLayer(this,(wchar_t *)0x0,ON_Color::UnsetColor);
            }
            else {
              pOVar9 = ON_ModelComponent::Id((ON_ModelComponent *)local_1a0._16_8_);
              local_238._0_4_ = pOVar9->Data1;
              local_238._4_2_ = pOVar9->Data2;
              local_238._6_2_ = pOVar9->Data3;
              OStack_230 = *(ON__UINT64 *)pOVar9->Data4;
              ON_3dmSettings::SetCurrentLayerId(&this->m_settings,*pOVar9);
            }
            ONX_ModelComponentIterator::~ONX_ModelComponentIterator
                      ((ONX_ModelComponentIterator *)&layer_1);
          }
        }
        bVar2 = ON_BinaryArchive::BeginRead3dmGroupTable((ON_BinaryArchive *)_table_filter_local);
        if (bVar2) {
          if (((uint)error_log_local & 0x100) != 0) {
            while( true ) {
              local_248 = (ON_Group *)0x0;
              bitmap._0_4_ = ON_BinaryArchive::Read3dmGroup
                                       ((ON_BinaryArchive *)_table_filter_local,&local_248);
              if (((int)bitmap == 0) || ((int)bitmap < 0)) break;
              AddModelComponentForExperts
                        ((ONX_Model *)settings_current_id_3.Data4,(ON_ModelComponent *)this,
                         SUB81(local_248,0),(bool)(error_log_local._7_1_ & 1),true);
              bVar2 = ON_ModelComponentReference::IsEmpty
                                ((ON_ModelComponentReference *)settings_current_id_3.Data4);
              ON_ModelComponentReference::~ON_ModelComponentReference
                        ((ON_ModelComponentReference *)settings_current_id_3.Data4);
              if ((bVar2) && (local_248 != (ON_Group *)0x0)) {
                (*(local_248->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
              }
            }
          }
          bVar2 = ON_BinaryArchive::EndRead3dmGroupTable((ON_BinaryArchive *)_table_filter_local);
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = ON_BinaryArchive::BeginRead3dmDimStyleTable((ON_BinaryArchive *)_table_filter_local)
        ;
        if (bVar2) {
          _auStack_268 = ON_3dmSettings::CurrentDimensionStyleId(&this->m_settings);
          local_26c = ON_3dmSettings::CurrentDimensionStyleIndex(&this->m_settings);
          bVar2 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)auStack_268);
          local_26d = (bVar2 ^ 0xffU) & 1;
          local_441 = local_26d == 0 && -1 < local_26c;
          local_26e = local_441;
          dimension_style = (ON_DimStyle *)0;
          local_278.m_s = (wchar_t *)(uchar  [8])0x0;
          ON_3dmSettings::SetCurrentDimensionStyleId(&this->m_settings,(ON_UUID)ZEXT816((ulong)0));
          if (((uint)error_log_local & 0x800) != 0) {
            while( true ) {
              OStack_288.m_s = (char *)0x0;
              bitmap._0_4_ = ON_BinaryArchive::Read3dmDimStyle
                                       ((ON_BinaryArchive *)_table_filter_local,
                                        (ON_DimStyle **)&stack0xfffffffffffffd78);
              if (((int)bitmap == 0) || ((int)bitmap < 0)) break;
              if ((local_26d & 1) == 0) {
LAB_005fb8ac:
                iVar6 = local_26c;
                local_443 = false;
                if ((local_26e & 1U) != 0) {
                  iVar5 = ON_ModelComponent::Index((ON_ModelComponent *)OStack_288.m_s);
                  local_443 = iVar6 == iVar5;
                }
                local_442 = local_443;
              }
              else {
                pOVar9 = ON_ModelComponent::Id((ON_ModelComponent *)OStack_288.m_s);
                bVar2 = ::operator==((ON_UUID_struct *)auStack_268,pOVar9);
                local_442 = true;
                if (!bVar2) goto LAB_005fb8ac;
              }
              local_2a0[0x17] = local_442;
              AddModelComponentForExperts
                        ((ONX_Model *)local_2a0,(ON_ModelComponent *)this,SUB81(OStack_288.m_s,0),
                         (bool)(error_log_local._7_1_ & 1),true);
              bVar2 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_2a0);
              ON_ModelComponentReference::~ON_ModelComponentReference
                        ((ON_ModelComponentReference *)local_2a0);
              if (bVar2) {
                if ((ON_DimStyle *)OStack_288.m_s != (ON_DimStyle *)0x0) {
                  (**(code **)(*(long *)OStack_288.m_s + 0x20))();
                }
              }
              else if ((local_2a0[0x17] & 1) != 0) {
                pOVar9 = ON_ModelComponent::Id((ON_ModelComponent *)OStack_288.m_s);
                model_light = *(ON_ModelGeometryComponent **)pOVar9;
                local_2a8 = *(long *)pOVar9->Data4;
                ON_3dmSettings::SetCurrentDimensionStyleId(&this->m_settings,*pOVar9);
                local_26d = 0;
                local_26e = false;
              }
            }
          }
          bVar2 = ON_BinaryArchive::EndRead3dmDimStyleTable((ON_BinaryArchive *)_table_filter_local)
          ;
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = ON_BinaryArchive::BeginRead3dmLightTable((ON_BinaryArchive *)_table_filter_local);
        if (bVar2) {
          if (((uint)error_log_local & 0x1000) != 0) {
            while( true ) {
              local_2b8 = (ON_ModelGeometryComponent *)0x0;
              bitmap._0_4_ = ON_BinaryArchive::Read3dmModelLight
                                       ((ON_BinaryArchive *)_table_filter_local,&local_2b8);
              if (((int)bitmap == 0) || ((int)bitmap < 0)) break;
              AddModelComponentForExperts
                        ((ONX_Model *)settings_current_id_4.Data4,(ON_ModelComponent *)this,
                         SUB81(local_2b8,0),(bool)(error_log_local._7_1_ & 1),true);
              bVar2 = ON_ModelComponentReference::IsEmpty
                                ((ON_ModelComponentReference *)settings_current_id_4.Data4);
              ON_ModelComponentReference::~ON_ModelComponentReference
                        ((ON_ModelComponentReference *)settings_current_id_4.Data4);
              if ((bVar2) && (local_2b8 != (ON_ModelGeometryComponent *)0x0)) {
                (*(local_2b8->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[4])();
              }
            }
          }
          bVar2 = ON_BinaryArchive::EndRead3dmLightTable((ON_BinaryArchive *)_table_filter_local);
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = ON_BinaryArchive::BeginRead3dmHatchPatternTable
                          ((ON_BinaryArchive *)_table_filter_local);
        if (bVar2) {
          _auStack_2d8 = ON_3dmSettings::CurrentHatchPatternId(&this->m_settings);
          local_2dc = -0x7fffffff;
          bVar2 = ::operator==(&ON_nil_uuid,(ON_UUID_struct *)auStack_2d8);
          local_2dd = (bVar2 ^ 0xffU) & 1;
          local_2de = 0;
          hatch_pattern = (ON_HatchPattern *)0;
          local_2e8.m_s = (wchar_t *)(uchar  [8])0x0;
          ON_3dmSettings::SetCurrentHatchPatternId(&this->m_settings,(ON_UUID)ZEXT816((ulong)0));
          if (((uint)error_log_local & 0x2000) != 0) {
            while( true ) {
              OStack_2f8.m_s = (char *)0x0;
              bitmap._0_4_ = ON_BinaryArchive::Read3dmHatchPattern
                                       ((ON_BinaryArchive *)_table_filter_local,
                                        (ON_HatchPattern **)&stack0xfffffffffffffd08);
              if (((int)bitmap == 0) || ((int)bitmap < 0)) break;
              if ((local_2dd & 1) == 0) {
LAB_005fbc0a:
                local_472 = false;
                if ((local_2de & 1) != 0) {
                  iVar6 = ON_ModelComponent::Index((ON_ModelComponent *)OStack_2f8.m_s);
                  local_472 = iVar6 == -0x7fffffff;
                }
                local_471 = local_472;
              }
              else {
                pOVar9 = ON_ModelComponent::Id((ON_ModelComponent *)OStack_2f8.m_s);
                bVar2 = ::operator==((ON_UUID_struct *)auStack_2d8,pOVar9);
                local_471 = true;
                if (!bVar2) goto LAB_005fbc0a;
              }
              local_310[0x17] = local_471;
              AddModelComponentForExperts
                        ((ONX_Model *)local_310,(ON_ModelComponent *)this,SUB81(OStack_2f8.m_s,0),
                         (bool)(error_log_local._7_1_ & 1),true);
              bVar2 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_310);
              ON_ModelComponentReference::~ON_ModelComponentReference
                        ((ON_ModelComponentReference *)local_310);
              if (bVar2) {
                if ((ON_HatchPattern *)OStack_2f8.m_s != (ON_HatchPattern *)0x0) {
                  (**(code **)(*(long *)OStack_2f8.m_s + 0x20))();
                }
              }
              else if ((local_310[0x17] & 1) != 0) {
                pOVar9 = ON_ModelComponent::Id((ON_ModelComponent *)OStack_2f8.m_s);
                instance_definition = *(ON_InstanceDefinition **)pOVar9;
                local_318.m_s = *(wchar_t **)pOVar9->Data4;
                ON_3dmSettings::SetCurrentHatchPatternId(&this->m_settings,*pOVar9);
                local_2dd = 0;
                local_2de = 0;
              }
            }
          }
          bVar2 = ON_BinaryArchive::EndRead3dmHatchPatternTable
                            ((ON_BinaryArchive *)_table_filter_local);
          if (!bVar2) {
            return false;
          }
        }
        bVar2 = ON_BinaryArchive::BeginRead3dmInstanceDefinitionTable
                          ((ON_BinaryArchive *)_table_filter_local);
        if (bVar2) {
          if (((uint)error_log_local & 0x4000) != 0) {
            while( true ) {
              local_338._16_8_ = (long *)0x0;
              bitmap._0_4_ = ON_BinaryArchive::Read3dmInstanceDefinition
                                       ((ON_BinaryArchive *)_table_filter_local,
                                        (ON_InstanceDefinition **)(local_338 + 0x10));
              if (((int)bitmap == 0) || ((int)bitmap < 0)) break;
              AddModelComponentForExperts
                        ((ONX_Model *)local_338,(ON_ModelComponent *)this,SUB81(local_338._16_8_,0),
                         (bool)(error_log_local._7_1_ & 1),true);
              bVar2 = ON_ModelComponentReference::IsEmpty((ON_ModelComponentReference *)local_338);
              ON_ModelComponentReference::~ON_ModelComponentReference
                        ((ON_ModelComponentReference *)local_338);
              if ((bVar2) && ((long *)local_338._16_8_ != (long *)0x0)) {
                (**(code **)(*(long *)local_338._16_8_ + 0x20))();
              }
            }
          }
          bVar2 = ON_BinaryArchive::EndRead3dmInstanceDefinitionTable
                            ((ON_BinaryArchive *)_table_filter_local);
          if (!bVar2) {
            return false;
          }
        }
        uVar3 = ON_BinaryArchive::CriticalErrorCount((ON_BinaryArchive *)_table_filter_local);
        this_local._7_1_ = uVar3 == 0;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ONX_Model::IncrementalReadBegin( 
  ON_BinaryArchive& archive,
  bool bManageComponents,
  unsigned int table_filter,
  ON_TextLog* error_log
  )
{
  Reset();

  const bool bResolveIdAndNameConflicts = true;
  const bool bUpdateComponentIdentification = true;

  int rc;

  if ( 0 == table_filter )
    table_filter = 0xFFFFFFFF; // read everything

  // STEP 1: REQUIRED - Read start section
  if ( !archive.Read3dmStartSection( &m_3dm_file_version, m_sStartSectionComments ) )
  {
    return false;
  }

  // STEP 2: REQUIRED - Read properties section
  if ( !archive.Read3dmProperties( m_properties ) )
  {
    return false;
  }

  // version of opennurbs used to write the file.
  m_3dm_opennurbs_version = archive.ArchiveOpenNURBSVersion();

  // STEP 3: REQUIRED - Read setting section
  if ( !archive.Read3dmSettings( m_settings ) )
  {
    return false;
  }

  // STEP 4: REQUIRED - Read embedded bitmap table
  if ( archive.BeginRead3dmBitmapTable() )
  {
    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::bitmap_table) & table_filter) )
    {
      for(;;)
      {
        ON_Bitmap* bitmap = nullptr;
        rc = archive.Read3dmBitmap(&bitmap);
        if ( rc==0 )
          break; // end of bitmap table
        if (rc < 0)
          break;
        if ( AddModelComponentForExperts(bitmap,bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty() )
          delete bitmap;
      }
    }

    // If BeginRead3dmBitmapTable() returns true, 
    // then you MUST call EndRead3dmBitmapTable().
    if ( !archive.EndRead3dmBitmapTable() )
    {
      return false;
    }
  }

  // STEP 5: REQUIRED - Read texture mapping table
  if ( archive.BeginRead3dmTextureMappingTable() )
  {
    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::texture_mapping_table) & table_filter) )
    {
      for(;;)
      {
        ON_TextureMapping* texture_mapping = nullptr;
        rc = archive.Read3dmTextureMapping(&texture_mapping);
        if ( rc==0 )
          break; // end of texture_mapping table
        if ( rc < 0 ) 
          break;
        if (AddModelComponentForExperts(texture_mapping, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
          delete texture_mapping;
      }
    }
    
    // If BeginRead3dmTextureMappingTable() returns true, 
    // then you MUST call EndRead3dmTextureMappingTable().
    if ( !archive.EndRead3dmTextureMappingTable() )
    {
      return false;
    }
  }


  // STEP 6: REQUIRED - Read render material table
  if ( archive.BeginRead3dmMaterialTable() )
  {
    const ON_UUID settings_current_id = m_settings.CurrentMaterialId();
    const int settings_current_index = m_settings.CurrentMaterialIndex();
    bool bSetCurrentById = !(ON_nil_uuid == settings_current_id);
    bool bSetCurrentByIndex = false == bSetCurrentById && settings_current_index >= 0;
    m_settings.SetCurrentMaterialId(ON_nil_uuid);
    
    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::material_table) & table_filter) )
    {
      for(;;)
      {
        ON_Material* material = nullptr;
        rc = archive.Read3dmMaterial(&material);
        if ( rc==0 )
          break; // end of material table
        if (rc < 0)
          break;
        // index or id might be modified by AddModelComponentForExperts()
        const bool bSetAsCurrent =
          (bSetCurrentById && settings_current_id == material->Id())
          || (bSetCurrentByIndex && settings_current_index == material->Index());
        if ( AddModelComponentForExperts(material,bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty() )
        {
          delete material;
        }
        else if (bSetAsCurrent)
        {
          m_settings.SetCurrentMaterialId(material->Id());
          bSetCurrentById = false;
          bSetCurrentByIndex = false;
        }
      }
    }

    // If BeginRead3dmMaterialTable() returns true, 
    // then you MUST call EndRead3dmMaterialTable().
    if ( !archive.EndRead3dmMaterialTable() )
    {
      return false;
    }
  }


  // STEP 7: REQUIRED - Read line type table
  if ( archive.BeginRead3dmLinetypeTable() )
  {
    const ON_UUID settings_current_id = m_settings.CurrentLinePatternId();
    const int settings_current_index = m_settings.CurrentLinePatternIndex();
    bool bSetCurrentById = !(ON_nil_uuid == settings_current_id);
    bool bSetCurrentByIndex = false == bSetCurrentById && settings_current_index >= 0;
    m_settings.SetCurrentLinePatternId(ON_nil_uuid);

    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::linetype_table) & table_filter) )
    {
      for(;;)
      {
        ON_Linetype* line_pattern = nullptr;
        rc = archive.Read3dmLinetype(&line_pattern);
        if ( rc==0 )
          break; // end of linetype table
        if (rc < 0)
          break;
        // index or id might be modified by AddModelComponentForExperts()
        const bool bSetAsCurrent =
          (bSetCurrentById && settings_current_id == line_pattern->Id())
          || (bSetCurrentByIndex && settings_current_index == line_pattern->Index());
        if ( AddModelComponentForExperts(line_pattern,bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty() )
        {
          delete line_pattern;
        }
        else if (bSetAsCurrent)
        {
          m_settings.SetCurrentLinePatternId(line_pattern->Id());
          bSetCurrentById = false;
          bSetCurrentByIndex = false;
        }
      }
    }

    // If BeginRead3dmLinetypeTable() returns true, 
    // then you MUST call EndRead3dmLinetypeTable().
    if ( !archive.EndRead3dmLinetypeTable() )
    {
      return false;
    }
  }

  // STEP 8: REQUIRED - Read layer table
  if ( archive.BeginRead3dmLayerTable() )
  {
    const ON_UUID settings_current_id = m_settings.CurrentLayerId();
    const int settings_current_index = m_settings.CurrentLayerIndex();
    bool bSetCurrentById = !(ON_nil_uuid == settings_current_id);
    bool bSetCurrentByIndex = false == bSetCurrentById && settings_current_index >= 0;
    m_settings.SetCurrentLayerId(ON_nil_uuid);

    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::layer_table) & table_filter) )
    {
      for(;;)
      {
        ON_Layer* layer = nullptr;
        rc = archive.Read3dmLayer(&layer);
        if ( rc==0 )
          break; // end of layer table
        if (rc < 0)
          break;
        // index or id might be modified by AddModelComponentForExperts()
        const bool bSetAsCurrent =
          (bSetCurrentById && settings_current_id == layer->Id())
          || (bSetCurrentByIndex && settings_current_index == layer->Index());
        if (AddModelComponentForExperts(layer, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
        {
          delete layer;
        }
        else if (bSetAsCurrent)
        {
          m_settings.SetCurrentLayerId(layer->Id());
          bSetCurrentById = false;
          bSetCurrentByIndex = false;
        }
      }
    }

    // If BeginRead3dmLayerTable() returns true, 
    // then you MUST call EndRead3dmLayerTable().
    if ( !archive.EndRead3dmLayerTable() )
    {
      return false;
    }

    ON_UUID current_layer_id = m_settings.CurrentLayerId();
    const ON_Layer* current_layer 
      = (ON_nil_uuid == current_layer_id)
      ? nullptr
      : ON_Layer::FromModelComponentRef(LayerFromId(current_layer_id), nullptr);
    if (nullptr == current_layer)
    {
      current_layer_id = ON_nil_uuid;
      int layer_count = 0;
      ONX_ModelComponentIterator layer_it(*this, ON_ModelComponent::Type::Layer);
      for (const ON_Layer* layer = ON_Layer::Cast(layer_it.FirstComponent()); nullptr != layer; layer = ON_Layer::Cast(layer_it.NextComponent()))
      {
        layer_count++;
        if (layer->IsVisible() && false == layer->IsLocked())
        {
          current_layer = layer;
          if ( layer->ParentIdIsNil() )
            break;
        }
      }
      if (nullptr == current_layer && layer_count > 0)
      {
        current_layer = ON_Layer::Cast(layer_it.FirstComponent());
      }
      if (nullptr != current_layer)
        m_settings.SetCurrentLayerId(current_layer->Id());
      else
        AddDefaultLayer(nullptr, ON_Color::UnsetColor);
    }
  }

  // STEP 9: REQUIRED - Read group table
  if ( archive.BeginRead3dmGroupTable() )
  {
    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::group_table) & table_filter) )
    {
      for(;;)
      {
        ON_Group* group = nullptr;
        rc = archive.Read3dmGroup(&group);
        if ( rc==0 )
          break; // end of group table
        if (rc < 0)
          break;
        if (AddModelComponentForExperts(group, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
          delete group;
      }
    }
    
    // If BeginRead3dmGroupTable() returns true, 
    // then you MUST call EndRead3dmGroupTable().
    if ( !archive.EndRead3dmGroupTable() )
    {
      return false;
    }
  }

  // STEP 11: REQUIRED - Read dimstyle table
  if ( archive.BeginRead3dmDimStyleTable() )
  {
    const ON_UUID settings_current_id = m_settings.CurrentDimensionStyleId();
    const int settings_current_index = m_settings.CurrentDimensionStyleIndex();
    bool bSetCurrentById = !(ON_nil_uuid == settings_current_id);
    bool bSetCurrentByIndex = false == bSetCurrentById && settings_current_index >= 0;
    m_settings.SetCurrentDimensionStyleId(ON_nil_uuid);

    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::dimension_style_table) & table_filter) )
    {
      for(;;)
      {
        ON_DimStyle* dimension_style = nullptr;
        rc = archive.Read3dmDimStyle(&dimension_style);
        if ( rc==0 )
          break; // end of dimstyle table
        if ( rc < 0 ) 
          break;
        // index or id might be modified by AddModelComponentForExperts()
        const bool bSetAsCurrent =
          (bSetCurrentById && settings_current_id == dimension_style->Id())
          || (bSetCurrentByIndex && settings_current_index == dimension_style->Index());
        if (AddModelComponentForExperts(dimension_style, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
        {
          delete dimension_style;
        }
        else if (bSetAsCurrent)
        {
          m_settings.SetCurrentDimensionStyleId(dimension_style->Id());
          bSetCurrentById = false;
          bSetCurrentByIndex = false;
        }
      }
    }
    
    // If BeginRead3dmDimStyleTable() returns true, 
    // then you MUST call EndRead3dmDimStyleTable().
    if ( !archive.EndRead3dmDimStyleTable() )
    {
      return false;
    }
  }

  // STEP 12: REQUIRED - Read render lights table
  if ( archive.BeginRead3dmLightTable() )
  {
    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::light_table) & table_filter) )
    {
      for(;;)
      {
        ON_ModelGeometryComponent* model_light = nullptr;
        rc = archive.Read3dmModelLight(&model_light);
        if (rc == 0)
          break; // end of light table
        if ( rc < 0 ) 
          break;
        if (AddModelComponentForExperts(model_light, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
          delete model_light;
      }
    }

    // If BeginRead3dmLightTable() returns true, 
    // then you MUST call EndRead3dmLightTable().
    if ( !archive.EndRead3dmLightTable() )
    {
      return false;
    }
  }

  // STEP 13 - read hatch pattern table
  if ( archive.BeginRead3dmHatchPatternTable() )
  {
    const ON_UUID settings_current_id = m_settings.CurrentHatchPatternId();
    const int settings_current_index = ON_UNSET_INT_INDEX;
    bool bSetCurrentById = !(ON_nil_uuid == settings_current_id);
    bool bSetCurrentByIndex = false;
    m_settings.SetCurrentHatchPatternId(ON_nil_uuid);

    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::hatchpattern_table) & table_filter) )
    {
      for(;;)
      {
        ON_HatchPattern* hatch_pattern = nullptr;
        rc = archive.Read3dmHatchPattern(&hatch_pattern);
        if ( rc==0 )
          break; // end of hatchpattern table
        if ( rc < 0 ) 
          break;
        // index or id might be modified by AddModelComponentForExperts()
        const bool bSetAsCurrent =
          (bSetCurrentById && settings_current_id == hatch_pattern->Id())
          || (bSetCurrentByIndex && settings_current_index == hatch_pattern->Index());
        if (AddModelComponentForExperts(hatch_pattern, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
        {
          delete hatch_pattern;
        }
        else if (bSetAsCurrent)
        {
          m_settings.SetCurrentHatchPatternId(hatch_pattern->Id());
          bSetCurrentById = false;
          bSetCurrentByIndex = false;
        }
      }
    }
    
    // If BeginRead3dmHatchPatternTable() returns true, 
    // then you MUST call EndRead3dmHatchPatternTable().
    if ( !archive.EndRead3dmHatchPatternTable() )
    {
      return false;
    }
  }

  // STEP 14: REQUIRED - Read instance definition table
  if ( archive.BeginRead3dmInstanceDefinitionTable() )
  {
    if ( 0 != (static_cast<unsigned int>(ON_3dmArchiveTableType::instance_definition_table) & table_filter) )
    {
      for(;;)
      {
        ON_InstanceDefinition* instance_definition = nullptr;
        rc = archive.Read3dmInstanceDefinition(&instance_definition);
        if ( rc==0 )
          break; // end of instance definition table
        if ( rc < 0 ) 
          break;
        if (AddModelComponentForExperts(instance_definition, bManageComponents,bResolveIdAndNameConflicts,bUpdateComponentIdentification).IsEmpty())
          delete instance_definition;
      }
    }
    
    // If BeginRead3dmInstanceDefinitionTable() returns true, 
    // then you MUST call EndRead3dmInstanceDefinitionTable().
    if ( !archive.EndRead3dmInstanceDefinitionTable() )
    {
      return false;
    }
  }

  return (0 == archive.CriticalErrorCount());
}